

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsPolygonItem::QGraphicsPolygonItem(QGraphicsPolygonItem *this,QGraphicsItem *parent)

{
  QGraphicsPolygonItemPrivate *this_00;
  QAbstractGraphicsShapeItem *in_RSI;
  QAbstractGraphicsShapeItemPrivate *in_RDI;
  
  this_00 = (QGraphicsPolygonItemPrivate *)operator_new(0x1c8);
  QGraphicsPolygonItemPrivate::QGraphicsPolygonItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(in_RSI,in_RDI,(QGraphicsItem *)this_00);
  (in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QGraphicsPolygonItem_00d32b10;
  return;
}

Assistant:

QGraphicsPolygonItem::QGraphicsPolygonItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPolygonItemPrivate, parent)
{
}